

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O2

void anon_unknown.dwarf_642426::CheckUnparsable(string *prv,string *pub,string *expected_error)

{
  long lVar1;
  iterator pvVar2;
  _Rb_tree_header *p_Var3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  check_type cVar5;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  lazy_ostream local_2d0;
  undefined1 *local_2c0;
  string *local_2b8;
  assertion_result local_2b0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_pub;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parse_priv;
  string error;
  FlatSigningProvider keys_pub;
  FlatSigningProvider keys_priv;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_0114ae68;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_0114ae68;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_pub.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  keys_pub.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keys_priv.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parse(&parse_priv,prv,&keys_priv,&error,false);
  pvVar2 = (iterator)0x0;
  Parse(&parse_pub,pub,&keys_pub,&error,false);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)p_Var3;
  msg.m_begin = pvVar2;
  file.m_end = (iterator)0x1d;
  file.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (parse_priv.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       parse_priv.
       super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_2d8 = "";
  pvVar2 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  local_2b8 = prv;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,1,WARN,_cVar5,(size_t)&local_2e0,0x1d);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x1e;
  file_00.m_begin = (iterator)&local_2f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_300,
             msg_00);
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (parse_pub.
        super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
       parse_pub.
       super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_308 = "";
  pvVar2 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  local_2b8 = pub;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,1,WARN,_cVar5,(size_t)&local_310,0x1e);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x1f;
  file_01.m_begin = (iterator)&local_320;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_330,
             msg_01);
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_2b8 = (string *)0xc694e1;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
  ;
  local_338 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_2d0,&local_340,0x1f,1,2,&error,"error",expected_error,"expected_error");
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&parse_pub);
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&parse_priv);
  std::__cxx11::string::~string((string *)&error);
  FlatSigningProvider::~FlatSigningProvider(&keys_pub);
  FlatSigningProvider::~FlatSigningProvider(&keys_priv);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckUnparsable(const std::string& prv, const std::string& pub, const std::string& expected_error)
{
    FlatSigningProvider keys_priv, keys_pub;
    std::string error;
    auto parse_priv = Parse(prv, keys_priv, error);
    auto parse_pub = Parse(pub, keys_pub, error);
    BOOST_CHECK_MESSAGE(parse_priv.empty(), prv);
    BOOST_CHECK_MESSAGE(parse_pub.empty(), pub);
    BOOST_CHECK_EQUAL(error, expected_error);
}